

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O1

void fidentity8x16_new_avx2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  undefined1 auVar1 [32];
  ulong uVar2;
  long lVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  
  uVar2 = 0xfffffffffffffffe;
  lVar3 = 0x10;
  auVar4._8_2_ = 1;
  auVar4._0_8_ = 0x1000100010001;
  auVar4._10_2_ = 1;
  auVar4._12_2_ = 1;
  auVar4._14_2_ = 1;
  auVar4._16_2_ = 1;
  auVar4._18_2_ = 1;
  auVar4._20_2_ = 1;
  auVar4._22_2_ = 1;
  auVar4._24_2_ = 1;
  auVar4._26_2_ = 1;
  auVar4._28_2_ = 1;
  auVar4._30_2_ = 1;
  auVar5._8_4_ = 0x8002d42;
  auVar5._0_8_ = 0x8002d4208002d42;
  auVar5._12_4_ = 0x8002d42;
  auVar5._16_4_ = 0x8002d42;
  auVar5._20_4_ = 0x8002d42;
  auVar5._24_4_ = 0x8002d42;
  auVar5._28_4_ = 0x8002d42;
  do {
    auVar6 = *(undefined1 (*) [32])((long)input[-1] + lVar3);
    auVar7 = vpunpcklwd_avx2(auVar6,auVar4);
    auVar1 = vpunpckhwd_avx2(auVar6,auVar4);
    auVar6 = vpmaddwd_avx2(auVar7,auVar5);
    auVar7 = vpsrad_avx2(auVar6,0xc);
    auVar6 = vpmaddwd_avx2(auVar1,auVar5);
    auVar6 = vpsrad_avx2(auVar6,0xc);
    auVar6 = vpackssdw_avx2(auVar7,auVar6);
    *(undefined1 (*) [32])((long)output[-1] + lVar3) = auVar6;
    uVar2 = uVar2 + 2;
    lVar3 = lVar3 + 0x20;
  } while (uVar2 < 0xe);
  return;
}

Assistant:

static inline void fidentity8x16_new_avx2(const __m128i *input, __m128i *output,
                                          int8_t cos_bit) {
  (void)cos_bit;
  const __m256i one = _mm256_set1_epi16(1);
  __m256i temp;
  for (int i = 0; i < 16; i += 2) {
    temp = _mm256_insertf128_si256(_mm256_castsi128_si256(input[i]),
                                   input[i + 1], 0x1);
    const __m256i a_lo = _mm256_unpacklo_epi16(temp, one);
    const __m256i a_hi = _mm256_unpackhi_epi16(temp, one);
    const __m256i b_lo = scale_round_avx2(a_lo, 2 * NewSqrt2);
    const __m256i b_hi = scale_round_avx2(a_hi, 2 * NewSqrt2);
    temp = _mm256_packs_epi32(b_lo, b_hi);
    output[i] = _mm256_castsi256_si128(temp);
    output[i + 1] = _mm256_extractf128_si256(temp, 0x1);
  }
}